

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O0

bool __thiscall QPDFTokenizer::Token::isWord(Token *this,string *value)

{
  __type_conflict1 local_19;
  string *value_local;
  Token *this_local;
  
  local_19 = false;
  if (this->type == tt_word) {
    local_19 = std::operator==(&this->value,value);
  }
  return local_19;
}

Assistant:

bool
        isWord(std::string const& value) const
        {
            return this->type == tt_word && this->value == value;
        }